

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Node * __thiscall capnp::compiler::Compiler::Impl::getBuiltin(Impl *this,Which which)

{
  Which which_local;
  Fault f;
  uint local_3c;
  DebugComparison<std::_Rb_tree_iterator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_&,_std::_Rb_tree_iterator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
  _kjCondition;
  iterator iter;
  
  which_local = which;
  iter._M_node = (_Base_ptr)
                 std::
                 _Rb_tree<capnp::compiler::Declaration::Which,_std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>,_std::_Select1st<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                 ::find(&(this->builtinDeclsByKind)._M_t,&which_local);
  _kjCondition.left = &iter;
  _kjCondition.right._M_node =
       &(this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header;
  _kjCondition.op.content.ptr = anon_var_dwarf_43885;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = iter._M_node != _kjCondition.right._M_node;
  if (_kjCondition.result) {
    return (Node *)iter._M_node[1]._M_parent;
  }
  local_3c = (uint)which_local;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<capnp::compiler::Declaration::Which_const,capnp::compiler::Compiler::Node*>>&,std::_Rb_tree_iterator<std::pair<capnp::compiler::Declaration::Which_const,capnp::compiler::Compiler::Node*>>>&,char_const(&)[16],unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x4d1,FAILED,"iter != builtinDeclsByKind.end()",
             "_kjCondition,\"invalid builtin\", (uint)which",&_kjCondition,
             (char (*) [16])"invalid builtin",&local_3c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Compiler::Node& Compiler::Impl::getBuiltin(Declaration::Which which) {
  auto iter = builtinDeclsByKind.find(which);
  KJ_REQUIRE(iter != builtinDeclsByKind.end(), "invalid builtin", (uint)which);
  return *iter->second;
}